

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void __thiscall
MutableS2ShapeIndex::ReserveSpace
          (MutableS2ShapeIndex *this,BatchDescriptor *batch,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *all_edges)

{
  uint uVar1;
  vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
  *pvVar2;
  pointer pRVar3;
  __uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_> _Var4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  RemovedShape *removed;
  long lVar8;
  pointer pRVar9;
  int iVar10;
  uint uVar11;
  double dVar12;
  int face_count [6];
  S2Point local_60 [2];
  
  uVar1 = batch->num_edges;
  if ((int)uVar1 < 0xd556) {
    for (lVar8 = 0; lVar8 != 0x90; lVar8 = lVar8 + 0x18) {
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      reserve((vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
               *)((long)&(all_edges->
                         super__Vector_base<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar8),(long)batch->num_edges)
      ;
    }
  }
  else {
    uVar7 = (ulong)uVar1 / 20000;
    iVar5 = (int)uVar7;
    face_count[4] = 0;
    face_count[5] = 0;
    face_count[0] = 0;
    face_count[1] = 0;
    face_count[2] = 0;
    face_count[3] = 0;
    pvVar2 = (this->pending_removals_)._M_t.
             super___uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
             .
             super__Head_base<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_false>
             ._M_head_impl;
    iVar10 = (int)((ulong)uVar1 / 10000);
    if (pvVar2 != (vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                   *)0x0) {
      pRVar3 = *(pointer *)
                ((long)&(pvVar2->
                        super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                        )._M_impl + 8);
      for (pRVar9 = *(pointer *)
                     &(pvVar2->
                      super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                      )._M_impl; pRVar9 != pRVar3; pRVar9 = pRVar9 + 1) {
        uVar11 = (int)uVar7 +
                 (int)(((long)*(pointer *)
                               ((long)&(pRVar9->edges).
                                       super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>
                               + 8) -
                       *(long *)&(pRVar9->edges).
                                 super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>.
                                 _M_impl) / 0x30);
        while( true ) {
          uVar7 = (ulong)uVar11;
          if ((int)uVar11 < iVar10) break;
          iVar6 = S2::GetFace((S2Point *)
                              ((long)(int)(uVar11 - iVar10) * 0x30 +
                              *(long *)&(pRVar9->edges).
                                        super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>
                                        ._M_impl));
          face_count[iVar6] = face_count[iVar6] + 1;
          uVar11 = uVar11 - iVar10;
        }
      }
    }
    for (lVar8 = (long)this->pending_additions_begin_; lVar8 < batch->additions_end;
        lVar8 = lVar8 + 1) {
      _Var4._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
      super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
           (this->shapes_).
           super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
           super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t;
      if ((_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)
          _Var4._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
          super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl != (S2Shape *)0x0) {
        iVar6 = (**(code **)(*(long *)_Var4._M_t.
                                      super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>
                                      .super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x10))
                          (_Var4._M_t.
                           super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                           super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl);
        uVar11 = (int)uVar7 + iVar6;
        while( true ) {
          uVar7 = (ulong)uVar11;
          if ((int)uVar11 < iVar10) break;
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                                super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x18))
                    (local_60,_Var4._M_t.
                              super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                              super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl,uVar11 - iVar10);
          iVar6 = S2::GetFace(local_60);
          face_count[iVar6] = face_count[iVar6] + 1;
          uVar11 = uVar11 - iVar10;
        }
      }
    }
    for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
      if (face_count[lVar8] != 0) {
        dVar12 = (double)batch->num_edges *
                 ((double)face_count[lVar8] *
                  (1.0 / (double)(int)((ulong)(iVar5 + uVar1) / ((ulong)uVar1 / 10000))) + 0.02);
        uVar7 = (ulong)dVar12;
        std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
        reserve(all_edges,(long)(dVar12 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7);
      }
      all_edges = all_edges + 1;
    }
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::ReserveSpace(const BatchDescriptor& batch,
                                       vector<FaceEdge> all_edges[6]) const {
  // If the number of edges is relatively small, then the fastest approach is
  // to simply reserve space on every face for the maximum possible number of
  // edges.  We use a different threshold for this calculation than for
  // deciding when to break updates into batches, because the cost/benefit
  // ratio is different.  (Here the only extra expense is that we need to
  // sample the edges to estimate how many edges per face there are.)
  const size_t kMaxCheapBytes = 30 << 20;  // 30 MB
  const int kMaxCheapEdges = kMaxCheapBytes / (6 * sizeof(FaceEdge));
  if (batch.num_edges <= kMaxCheapEdges) {
    for (int face = 0; face < 6; ++face) {
      all_edges[face].reserve(batch.num_edges);
    }
    return;
  }
  // Otherwise we estimate the number of edges on each face by taking a random
  // sample.  The goal is to come up with an estimate that is fast and
  // accurate for non-pathological geometry.  If our estimates happen to be
  // wrong, the vector will still grow automatically - the main side effects
  // are that memory usage will be larger (by up to a factor of 3), and
  // constructing the index will be about 10% slower.
  //
  // Given a desired sample size, we choose equally spaced edges from
  // throughout the entire data set.  We use a Bresenham-type algorithm to
  // choose the samples.
  const int kDesiredSampleSize = 10000;
  const int sample_interval = max(1, batch.num_edges / kDesiredSampleSize);

  // Initialize "edge_id" to be midway through the first sample interval.
  // Because samples are equally spaced the actual sample size may differ
  // slightly from the desired sample size.
  int edge_id = sample_interval / 2;
  const int actual_sample_size = (batch.num_edges + edge_id) / sample_interval;
  int face_count[6] = { 0, 0, 0, 0, 0, 0 };
  if (pending_removals_) {
    for (const RemovedShape& removed : *pending_removals_) {
      edge_id += removed.edges.size();
      while (edge_id >= sample_interval) {
        edge_id -= sample_interval;
        face_count[S2::GetFace(removed.edges[edge_id].v0)] += 1;
      }
    }
  }
  for (int id = pending_additions_begin_; id < batch.additions_end; ++id) {
    const S2Shape* shape = this->shape(id);
    if (shape == nullptr) continue;
    edge_id += shape->num_edges();
    while (edge_id >= sample_interval) {
      edge_id -= sample_interval;
      // For speed, we only count the face containing one endpoint of the
      // edge.  In general the edge could span all 6 faces (with padding), but
      // it's not worth the expense to compute this more accurately.
      face_count[S2::GetFace(shape->edge(edge_id).v0)] += 1;
    }
  }
  // Now given the raw face counts, compute a confidence interval such that we
  // will be unlikely to allocate too little space.  Computing accurate
  // binomial confidence intervals is expensive and not really necessary.
  // Instead we use a simple approximation:
  //  - For any face with at least 1 sample, we use at least a 4-sigma
  //    confidence interval.  (The chosen width is adequate for the worst case
  //    accuracy, which occurs when the face contains approximately 50% of the
  //    edges.)  Assuming that our sample is representative, the probability of
  //    reserving too little space is approximately 1 in 30,000.
  //  - For faces with no samples at all, we don't bother reserving space.
  //    It is quite likely that such faces are truly empty, so we save time
  //    and memory this way.  If the face does contain some edges, there will
  //    only be a few so it is fine to let the vector grow automatically.
  // On average, we reserve 2% extra space for each face that has geometry.

  // kMaxSemiWidth is the maximum semi-width over all probabilities p of a
  // 4-sigma binomial confidence interval with a sample size of 10,000.
  const double kMaxSemiWidth = 0.02;
  const double sample_ratio = 1.0 / actual_sample_size;
  for (int face = 0; face < 6; ++face) {
    if (face_count[face] == 0) continue;
    double fraction = sample_ratio * face_count[face] + kMaxSemiWidth;
    all_edges[face].reserve(fraction * batch.num_edges);
  }
}